

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_param_tests.hpp
# Opt level: O2

iuParamGenerator<float> __thiscall iutest::CSV<float>(iutest *this,char *path,char delimiter)

{
  iuCsvFileParamsGenerator<float> *this_00;
  _Interface *extraout_RDX;
  iuParamGenerator<float> iVar1;
  allocator<char> local_41;
  string local_40;
  
  this_00 = (iuCsvFileParamsGenerator<float> *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_41);
  detail::iuCsvFileParamsGenerator<float>::iuCsvFileParamsGenerator(this_00,&local_40,delimiter);
  *(undefined ***)this = &PTR__iuIParamGenerator_00143990;
  *(iuCsvFileParamsGenerator<float> **)(this + 8) = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  iVar1.m_pInterface = extraout_RDX;
  iVar1.super_iuIParamGenerator<int>._vptr_iuIParamGenerator = (_func_int **)this;
  return iVar1;
}

Assistant:

detail::iuParamGenerator<T> IUTEST_ATTRIBUTE_UNUSED_ CSV(const char* path, char delimiter = ',')
{
    return new detail::iuCsvFileParamsGenerator<T>(path, delimiter);
}